

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O3

CURLcode setup_connection_internals(connectdata *conn)

{
  SessionHandle *pSVar1;
  void *pvVar2;
  char *pcVar3;
  CURLcode CVar4;
  Curl_handler *pCVar5;
  
  pSVar1 = conn->data;
  pvVar2 = (pSVar1->req).protop;
  if (pvVar2 != (void *)0x0) {
    (*Curl_cfree)(pvVar2);
    (pSVar1->req).protop = (void *)0x0;
  }
  pcVar3 = (pSVar1->req).newurl;
  if (pcVar3 != (char *)0x0) {
    (*Curl_cfree)(pcVar3);
  }
  memset(&pSVar1->req,0,0x138);
  (pSVar1->req).maxdownload = -1;
  conn->socktype = 1;
  pCVar5 = conn->handler;
  if (pCVar5->setup_connection != (_func_CURLcode_connectdata_ptr *)0x0) {
    CVar4 = (*pCVar5->setup_connection)(conn);
    if (CVar4 != CURLE_OK) {
      return CVar4;
    }
    pCVar5 = conn->handler;
  }
  if (conn->port < 0) {
    conn->port = pCVar5->defport;
  }
  if (conn->remote_port < 0) {
    conn->remote_port = (uint)(ushort)conn->given->defport;
  }
  return CURLE_OK;
}

Assistant:

static CURLcode setup_connection_internals(struct connectdata *conn)
{
  const struct Curl_handler * p;
  CURLcode result;
  struct SessionHandle *data = conn->data;

  /* in some case in the multi state-machine, we go back to the CONNECT state
     and then a second (or third or...) call to this function will be made
     without doing a DISCONNECT or DONE in between (since the connection is
     yet in place) and therefore this function needs to first make sure
     there's no lingering previous data allocated. */
  Curl_free_request_state(data);

  memset(&data->req, 0, sizeof(struct SingleRequest));
  data->req.maxdownload = -1;

  conn->socktype = SOCK_STREAM; /* most of them are TCP streams */

  /* Perform setup complement if some. */
  p = conn->handler;

  if(p->setup_connection) {
    result = (*p->setup_connection)(conn);

    if(result != CURLE_OK)
      return result;

    p = conn->handler;              /* May have changed. */
  }

  if(conn->port < 0)
    /* we check for -1 here since if proxy was detected already, this
       was very likely already set to the proxy port */
    conn->port = p->defport;

  /* only if remote_port was not already parsed off the URL we use the
     default port number */
  if(conn->remote_port < 0)
    conn->remote_port = (unsigned short)conn->given->defport;

  return CURLE_OK;
}